

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

int fmt::v10::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  basic_fp<unsigned___int128> value_00;
  buffer<char> *pbVar9;
  int iVar10;
  uint uVar11;
  size_t sVar12;
  ulong uVar13;
  decimal_fp<float> dVar14;
  format_error *this;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  int k;
  uint uVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  bool bVar24;
  bool bVar25;
  float fVar26;
  decimal_fp<double> dVar27;
  uint128_fallback uVar28;
  int local_7c;
  ulong local_78;
  ulong local_70;
  buffer<char> *local_68;
  double local_60;
  ulong local_58;
  undefined8 uStack_50;
  int local_48;
  undefined4 uStack_44;
  undefined8 uStack_40;
  
  if (value < 0.0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/fmt/include/fmt/format.h"
                ,0xcce,"value is negative");
  }
  local_78 = (ulong)specs & 0xff00000000;
  if (value <= 0.0) {
    if (precision < 1 || local_78 != 0x200000000) {
      sVar12 = buf->size_;
      uVar23 = sVar12 + 1;
      if (buf->capacity_ < uVar23) {
        (**buf->_vptr_buffer)(buf);
        sVar12 = buf->size_;
        uVar23 = sVar12 + 1;
      }
      buf->size_ = uVar23;
      buf->ptr_[sVar12] = '0';
      return 0;
    }
    uVar22 = (ulong)(uint)precision;
    uVar23 = buf->capacity_;
    if (uVar23 < uVar22) {
      (**buf->_vptr_buffer)(buf,uVar22);
      uVar23 = buf->capacity_;
    }
    if (uVar22 <= uVar23) {
      uVar23 = uVar22;
    }
    buf->size_ = uVar23;
    memset(buf->ptr_,0x30,uVar22);
    return -precision;
  }
  local_70 = (ulong)specs >> 0x20;
  if (precision < 0) {
    if ((specs._4_4_ >> 0x12 & 1) == 0) {
      dVar27 = dragonbox::to_decimal<double>(value);
      write<char,_fmt::v10::appender,_unsigned_long,_0>((appender)buf,dVar27.significand);
      return dVar27.exponent;
    }
    dVar14 = dragonbox::to_decimal<float>((float)value);
    write<char,_fmt::v10::appender,_unsigned_int,_0>((appender)buf,dVar14.significand);
    return dVar14.exponent;
  }
  uVar23 = (ulong)value & 0xfffffffffffff;
  uVar19 = (uint)((ulong)value >> 0x20);
  local_68 = buf;
  local_60 = value;
  if ((ulong)value < 0x10000000000000) {
    if (uVar23 == 0) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/fmt/include/fmt/format.h"
                  ,0xd07,"zeros should not appear here");
    }
    uVar22 = 0x3f;
    if (uVar23 != 0) {
      for (; uVar23 >> uVar22 == 0; uVar22 = uVar22 - 1) {
      }
    }
    iVar10 = -0x427 - (int)(uVar22 ^ 0x3f);
    lVar21 = uVar23 << ((char)(uVar22 ^ 0x3f) - 10U & 0x3f);
  }
  else {
    iVar10 = (uVar19 >> 0x14) - 0x433;
    lVar21 = uVar23 * 2 + 0x20000000000000;
  }
  iVar17 = iVar10 * 0x4d105 >> 0x14;
  k = 2 - iVar17;
  iVar17 = iVar17 + -2;
  uVar22 = lVar21 << ((char)((uint)(k * 0x1a934f) >> 0x13) + (char)iVar10 & 0x3fU);
  uVar28 = dragonbox::cache_accessor<double>::get_cached_power(k);
  pbVar9 = local_68;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar22;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar28.hi_;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar22;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar28.lo_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = SUB168(auVar3 * auVar7,8);
  auVar8 = auVar2 * auVar6 + auVar8;
  lVar21 = auVar8._0_8_;
  uVar18 = auVar8._8_8_;
  uVar22 = uVar18 * 10;
  if (999999999999999999 < uVar18) {
    uVar22 = uVar18;
  }
  uVar11 = 999999999999999999 < uVar18 | 0x12;
  if (local_78 == 0x200000000) {
    uVar20 = iVar17 + uVar11;
    if ((uVar20 ^ 0x7fffffff) < (uint)precision && 0 < (int)uVar20) {
      this = (format_error *)__cxa_allocate_exception(0x10);
      format_error::runtime_error(this,"number is too big");
      __cxa_throw(this,&format_error::typeinfo,std::runtime_error::~runtime_error);
    }
    precision = uVar20 + precision;
  }
  uVar20 = (uint)local_70;
  if (uVar11 - precision == 0 || (int)uVar11 < precision) {
    local_7c = uVar11 + iVar17 + -1;
    if ((uVar20 >> 0x12 & 1) == 0) {
      uVar22 = (ulong)value & 0x7ff0000000000000;
      local_58 = uVar23 | 0x10000000000000;
      if (uVar22 == 0) {
        local_58 = uVar23;
      }
      local_48 = -0x432;
      if (uVar22 != 0) {
        local_48 = (uVar19 >> 0x14) - 0x433;
      }
      bVar25 = uVar23 == 0;
      bVar24 = uVar22 >> 0x35 != 0;
    }
    else {
      fVar26 = (float)local_60;
      uVar19 = (uint)fVar26 & 0x7fffff;
      uVar11 = (uint)fVar26 & 0x7f800000;
      local_58 = (ulong)uVar19 + 0x800000;
      if (uVar11 == 0) {
        local_58 = (ulong)uVar19;
      }
      local_48 = -0x95;
      if (uVar11 != 0) {
        local_48 = ((uint)fVar26 >> 0x17) - 0x96;
      }
      bVar25 = uVar19 == 0;
      bVar24 = 0xffffff < uVar11;
    }
    uVar19 = (byte)(bVar24 & bVar25) + 4;
    if (local_78 != 0x200000000) {
      uVar19 = (uint)(byte)(bVar24 & bVar25);
    }
    uVar11 = 0x2ff;
    if ((uint)precision < 0x2ff) {
      uVar11 = precision;
    }
    uStack_50 = 0;
    value_00._20_4_ = uStack_44;
    value_00.e = local_48;
    value_00.f._8_8_ = 0;
    value_00.f._0_8_ = local_58;
    value_00._24_8_ = uStack_40;
    format_dragon(value_00,uVar19,uVar11,local_68,&local_7c);
    goto LAB_001683c3;
  }
  if (precision < 1) {
    local_7c = iVar17 + uVar11;
    if (precision < 0) {
      local_68->size_ = 0;
    }
    else {
      uVar23 = 1;
      if (local_68->capacity_ == 0) {
        (**local_68->_vptr_buffer)(local_68,1);
        uVar23 = (ulong)(pbVar9->capacity_ != 0);
      }
      pbVar9->size_ = uVar23;
      if ((uVar22 | lVar21 != 0) < 0x4563918244f40001) {
        *pbVar9->ptr_ = '0';
      }
      else {
        *pbVar9->ptr_ = '1';
      }
    }
    uVar20 = (uint)local_70;
    goto LAB_001683c3;
  }
  local_7c = (uVar11 - precision) + iVar17;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar22;
  uVar23 = SUB168(auVar4 * ZEXT816(0x6df37f675ef6eae0),8) >> 0x20;
  uVar18 = 9;
  if ((uint)precision < 9) {
    uVar18 = (ulong)(uint)precision;
  }
  pcVar1 = local_68->ptr_;
  if ((uVar18 & 1) == 0) {
    uVar13 = (uVar23 * 0x1ad7f29b >> 0x14) + 1;
    uVar16 = uVar13 >> 0x20;
    *(undefined2 *)pcVar1 =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + uVar16 * 2);
    uVar19 = 2;
  }
  else {
    uVar13 = (uVar23 * 0x2af31dc5 >> 0x18) + 1;
    uVar16 = uVar13 >> 0x20;
    *pcVar1 = (char)(uVar13 >> 0x20) + '0';
    uVar19 = 1;
  }
  uVar22 = uVar23 * -10000000000 + uVar22;
  if (uVar19 < (uint)precision) {
    uVar23 = (ulong)uVar19;
    do {
      uVar13 = (uVar13 & 0xffffffff) * 100;
      uVar16 = uVar13 >> 0x20;
      *(undefined2 *)(pcVar1 + uVar23) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + uVar16 * 2);
      uVar23 = uVar23 + 2;
    } while (uVar23 < uVar18);
    if (9 < precision) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar22;
      uVar19 = precision - 9;
      pcVar1 = local_68->ptr_;
      uVar23 = SUB168(auVar5 * ZEXT816(0x199999999999999a),8) & 0xffffffff;
      if ((uVar19 & 1) == 0) {
        uVar13 = (uVar23 * 0x1ad7f29b >> 0x14) + 1;
        uVar23 = uVar13 >> 0x20;
        *(undefined2 *)(pcVar1 + 9) =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + uVar23 * 2);
        uVar11 = 2;
      }
      else {
        uVar13 = (uVar23 * 0x2af31dc5 >> 0x18) + 1;
        uVar23 = uVar13 >> 0x20;
        pcVar1[9] = (char)(uVar13 >> 0x20) + '0';
        uVar11 = 1;
      }
      uVar15 = (int)uVar22 + SUB164(auVar5 * ZEXT816(0x199999999999999a),8) * -10;
      if (uVar11 < uVar19) {
        uVar22 = (ulong)uVar11;
        do {
          uVar13 = (uVar13 & 0xffffffff) * 100;
          uVar23 = uVar13 >> 0x20;
          *(undefined2 *)(pcVar1 + uVar22 + 9) =
               *(undefined2 *)
                (
                "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                + uVar23 * 2);
          uVar22 = uVar22 + 2;
        } while (uVar22 < uVar19);
        if (0x11 < precision) {
          if (uVar15 < 6) {
            uVar19 = precision;
            if (uVar15 == 5) goto joined_r0x0016844a;
            goto LAB_00168391;
          }
          goto LAB_0016832c;
        }
      }
      if ((uint)(char32_t)uVar13 < (uint)anon_var_dwarf_1a3786[0x11 - precision]) {
        uVar19 = (uint)(char32_t)uVar13 >> 0x1f &
                 ((uint)uVar23 | (uint)(uVar15 != 0 || lVar21 != 0));
        goto joined_r0x001682fd;
      }
      goto LAB_00168303;
    }
    if (precision != 9) goto LAB_001681c6;
    if (5000000000 < uVar22) {
LAB_0016832c:
      local_68->ptr_[(ulong)(uint)precision - 1] =
           local_68->ptr_[(ulong)(uint)precision - 1] + '\x01';
      goto LAB_00168337;
    }
    uVar19 = 9;
    if (uVar22 == 5000000000) {
joined_r0x0016844a:
      if ((lVar21 != 0) || ((uVar13 & 0x100000000) != 0)) goto LAB_0016832c;
    }
  }
  else {
LAB_001681c6:
    if ((uint)(char32_t)uVar13 < (uint)anon_var_dwarf_1a3786[8 - (int)uVar18]) {
      uVar19 = ((uint)uVar16 | (uint)(uVar22 != 0 || lVar21 != 0)) & (uint)(char32_t)uVar13 >> 0x1f;
joined_r0x001682fd:
      if (uVar19 != 0) goto LAB_00168303;
    }
    else {
LAB_00168303:
      local_68->ptr_[(ulong)(uint)precision - 1] =
           local_68->ptr_[(ulong)(uint)precision - 1] + '\x01';
      uVar23 = 1;
      if (precision != 1) {
LAB_00168337:
        uVar23 = (ulong)(uint)precision;
        uVar22 = uVar23 - 1;
        do {
          if (local_68->ptr_[uVar22 & 0xffffffff] < ':') break;
          local_68->ptr_[uVar22 & 0xffffffff] = '0';
          local_68->ptr_[uVar22 - 1] = local_68->ptr_[uVar22 - 1] + '\x01';
          uVar22 = uVar22 - 1;
        } while (2 < (int)uVar22 + 2);
      }
      if ('9' < *local_68->ptr_) {
        *local_68->ptr_ = '1';
        if (local_78 == 0x200000000) {
          precision = precision + 1;
          local_68->ptr_[uVar23] = '0';
        }
        else {
          local_7c = local_7c + 1;
        }
      }
    }
    uVar19 = precision;
    if (precision < 0) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/fmt/include/fmt/core.h"
                  ,0x17a,"negative value");
    }
  }
LAB_00168391:
  uVar22 = (ulong)uVar19;
  uVar23 = local_68->capacity_;
  if (uVar23 < uVar22) {
    (**local_68->_vptr_buffer)(local_68,uVar22);
    uVar23 = pbVar9->capacity_;
  }
  if (uVar23 < uVar22) {
    uVar22 = uVar23;
  }
  pbVar9->size_ = uVar22;
LAB_001683c3:
  if ((uVar20 >> 0x13 & 1) == 0 && local_78 != 0x200000000) {
    uVar23 = pbVar9->size_;
    if (uVar23 != 0) {
      do {
        iVar10 = local_7c + 1;
        if (pbVar9->ptr_[uVar23 - 1] != '0') {
          uVar22 = pbVar9->capacity_;
          if (uVar22 < uVar23) {
            (**pbVar9->_vptr_buffer)(pbVar9,uVar23);
            uVar22 = pbVar9->capacity_;
          }
          goto LAB_00168408;
        }
        uVar23 = uVar23 - 1;
        local_7c = iVar10;
      } while (uVar23 != 0);
    }
    uVar22 = pbVar9->capacity_;
    uVar23 = 0;
LAB_00168408:
    if (uVar22 < uVar23) {
      uVar23 = uVar22;
    }
    pbVar9->size_ = uVar23;
  }
  return local_7c;
}

Assistant:

FMT_CONSTEXPR20 auto format_float(Float value, int precision, float_specs specs,
                                  buffer<char>& buf) -> int {
  // float is passed as double to reduce the number of instantiations.
  static_assert(!std::is_same<Float, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");
  auto converted_value = convert_float(value);

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    fill_n(buf.data(), precision, '0');
    return -precision;
  }

  int exp = 0;
  bool use_dragon = true;
  unsigned dragon_flags = 0;
  if (!is_fast_float<Float>() || is_constant_evaluated()) {
    const auto inv_log2_10 = 0.3010299956639812;  // 1 / log2(10)
    using info = dragonbox::float_info<decltype(converted_value)>;
    const auto f = basic_fp<typename info::carrier_uint>(converted_value);
    // Compute exp, an approximate power of 10, such that
    //   10^(exp - 1) <= value < 10^exp or 10^exp <= value < 10^(exp + 1).
    // This is based on log10(value) == log2(value) / log2(10) and approximation
    // of log2(value) by e + num_fraction_bits idea from double-conversion.
    auto e = (f.e + count_digits<1>(f.f) - 1) * inv_log2_10 - 1e-10;
    exp = static_cast<int>(e);
    if (e > exp) ++exp;  // Compute ceil.
    dragon_flags = dragon::fixup;
  } else if (precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  } else {
    // Extract significand bits and exponent bits.
    using info = dragonbox::float_info<double>;
    auto br = bit_cast<uint64_t>(static_cast<double>(value));

    const uint64_t significand_mask =
        (static_cast<uint64_t>(1) << num_significand_bits<double>()) - 1;
    uint64_t significand = (br & significand_mask);
    int exponent = static_cast<int>((br & exponent_mask<double>()) >>
                                    num_significand_bits<double>());

    if (exponent != 0) {  // Check if normal.
      exponent -= exponent_bias<double>() + num_significand_bits<double>();
      significand |=
          (static_cast<uint64_t>(1) << num_significand_bits<double>());
      significand <<= 1;
    } else {
      // Normalize subnormal inputs.
      FMT_ASSERT(significand != 0, "zeros should not appear here");
      int shift = countl_zero(significand);
      FMT_ASSERT(shift >= num_bits<uint64_t>() - num_significand_bits<double>(),
                 "");
      shift -= (num_bits<uint64_t>() - num_significand_bits<double>() - 2);
      exponent = (std::numeric_limits<double>::min_exponent -
                  num_significand_bits<double>()) -
                 shift;
      significand <<= shift;
    }

    // Compute the first several nonzero decimal significand digits.
    // We call the number we get the first segment.
    const int k = info::kappa - dragonbox::floor_log10_pow2(exponent);
    exp = -k;
    const int beta = exponent + dragonbox::floor_log2_pow10(k);
    uint64_t first_segment;
    bool has_more_segments;
    int digits_in_the_first_segment;
    {
      const auto r = dragonbox::umul192_upper128(
          significand << beta, dragonbox::get_cached_power(k));
      first_segment = r.high();
      has_more_segments = r.low() != 0;

      // The first segment can have 18 ~ 19 digits.
      if (first_segment >= 1000000000000000000ULL) {
        digits_in_the_first_segment = 19;
      } else {
        // When it is of 18-digits, we align it to 19-digits by adding a bogus
        // zero at the end.
        digits_in_the_first_segment = 18;
        first_segment *= 10;
      }
    }

    // Compute the actual number of decimal digits to print.
    if (fixed) adjust_precision(precision, exp + digits_in_the_first_segment);

    // Use Dragon4 only when there might be not enough digits in the first
    // segment.
    if (digits_in_the_first_segment > precision) {
      use_dragon = false;

      if (precision <= 0) {
        exp += digits_in_the_first_segment;

        if (precision < 0) {
          // Nothing to do, since all we have are just leading zeros.
          buf.try_resize(0);
        } else {
          // We may need to round-up.
          buf.try_resize(1);
          if ((first_segment | static_cast<uint64_t>(has_more_segments)) >
              5000000000000000000ULL) {
            buf[0] = '1';
          } else {
            buf[0] = '0';
          }
        }
      }  // precision <= 0
      else {
        exp += digits_in_the_first_segment - precision;

        // When precision > 0, we divide the first segment into three
        // subsegments, each with 9, 9, and 0 ~ 1 digits so that each fits
        // in 32-bits which usually allows faster calculation than in
        // 64-bits. Since some compiler (e.g. MSVC) doesn't know how to optimize
        // division-by-constant for large 64-bit divisors, we do it here
        // manually. The magic number 7922816251426433760 below is equal to
        // ceil(2^(64+32) / 10^10).
        const uint32_t first_subsegment = static_cast<uint32_t>(
            dragonbox::umul128_upper64(first_segment, 7922816251426433760ULL) >>
            32);
        const uint64_t second_third_subsegments =
            first_segment - first_subsegment * 10000000000ULL;

        uint64_t prod;
        uint32_t digits;
        bool should_round_up;
        int number_of_digits_to_print = precision > 9 ? 9 : precision;

        // Print a 9-digits subsegment, either the first or the second.
        auto print_subsegment = [&](uint32_t subsegment, char* buffer) {
          int number_of_digits_printed = 0;

          // If we want to print an odd number of digits from the subsegment,
          if ((number_of_digits_to_print & 1) != 0) {
            // Convert to 64-bit fixed-point fractional form with 1-digit
            // integer part. The magic number 720575941 is a good enough
            // approximation of 2^(32 + 24) / 10^8; see
            // https://jk-jeon.github.io/posts/2022/12/fixed-precision-formatting/#fixed-length-case
            // for details.
            prod = ((subsegment * static_cast<uint64_t>(720575941)) >> 24) + 1;
            digits = static_cast<uint32_t>(prod >> 32);
            *buffer = static_cast<char>('0' + digits);
            number_of_digits_printed++;
          }
          // If we want to print an even number of digits from the
          // first_subsegment,
          else {
            // Convert to 64-bit fixed-point fractional form with 2-digits
            // integer part. The magic number 450359963 is a good enough
            // approximation of 2^(32 + 20) / 10^7; see
            // https://jk-jeon.github.io/posts/2022/12/fixed-precision-formatting/#fixed-length-case
            // for details.
            prod = ((subsegment * static_cast<uint64_t>(450359963)) >> 20) + 1;
            digits = static_cast<uint32_t>(prod >> 32);
            copy2(buffer, digits2(digits));
            number_of_digits_printed += 2;
          }

          // Print all digit pairs.
          while (number_of_digits_printed < number_of_digits_to_print) {
            prod = static_cast<uint32_t>(prod) * static_cast<uint64_t>(100);
            digits = static_cast<uint32_t>(prod >> 32);
            copy2(buffer + number_of_digits_printed, digits2(digits));
            number_of_digits_printed += 2;
          }
        };

        // Print first subsegment.
        print_subsegment(first_subsegment, buf.data());

        // Perform rounding if the first subsegment is the last subsegment to
        // print.
        if (precision <= 9) {
          // Rounding inside the subsegment.
          // We round-up if:
          //  - either the fractional part is strictly larger than 1/2, or
          //  - the fractional part is exactly 1/2 and the last digit is odd.
          // We rely on the following observations:
          //  - If fractional_part >= threshold, then the fractional part is
          //    strictly larger than 1/2.
          //  - If the MSB of fractional_part is set, then the fractional part
          //    must be at least 1/2.
          //  - When the MSB of fractional_part is set, either
          //    second_third_subsegments being nonzero or has_more_segments
          //    being true means there are further digits not printed, so the
          //    fractional part is strictly larger than 1/2.
          if (precision < 9) {
            uint32_t fractional_part = static_cast<uint32_t>(prod);
            should_round_up =
                fractional_part >= fractional_part_rounding_thresholds(
                                       8 - number_of_digits_to_print) ||
                ((fractional_part >> 31) &
                 ((digits & 1) | (second_third_subsegments != 0) |
                  has_more_segments)) != 0;
          }
          // Rounding at the subsegment boundary.
          // In this case, the fractional part is at least 1/2 if and only if
          // second_third_subsegments >= 5000000000ULL, and is strictly larger
          // than 1/2 if we further have either second_third_subsegments >
          // 5000000000ULL or has_more_segments == true.
          else {
            should_round_up = second_third_subsegments > 5000000000ULL ||
                              (second_third_subsegments == 5000000000ULL &&
                               ((digits & 1) != 0 || has_more_segments));
          }
        }
        // Otherwise, print the second subsegment.
        else {
          // Compilers are not aware of how to leverage the maximum value of
          // second_third_subsegments to find out a better magic number which
          // allows us to eliminate an additional shift. 1844674407370955162 =
          // ceil(2^64/10) < ceil(2^64*(10^9/(10^10 - 1))).
          const uint32_t second_subsegment =
              static_cast<uint32_t>(dragonbox::umul128_upper64(
                  second_third_subsegments, 1844674407370955162ULL));
          const uint32_t third_subsegment =
              static_cast<uint32_t>(second_third_subsegments) -
              second_subsegment * 10;

          number_of_digits_to_print = precision - 9;
          print_subsegment(second_subsegment, buf.data() + 9);

          // Rounding inside the subsegment.
          if (precision < 18) {
            // The condition third_subsegment != 0 implies that the segment was
            // of 19 digits, so in this case the third segment should be
            // consisting of a genuine digit from the input.
            uint32_t fractional_part = static_cast<uint32_t>(prod);
            should_round_up =
                fractional_part >= fractional_part_rounding_thresholds(
                                       8 - number_of_digits_to_print) ||
                ((fractional_part >> 31) &
                 ((digits & 1) | (third_subsegment != 0) |
                  has_more_segments)) != 0;
          }
          // Rounding at the subsegment boundary.
          else {
            // In this case, the segment must be of 19 digits, thus
            // the third subsegment should be consisting of a genuine digit from
            // the input.
            should_round_up = third_subsegment > 5 ||
                              (third_subsegment == 5 &&
                               ((digits & 1) != 0 || has_more_segments));
          }
        }

        // Round-up if necessary.
        if (should_round_up) {
          ++buf[precision - 1];
          for (int i = precision - 1; i > 0 && buf[i] > '9'; --i) {
            buf[i] = '0';
            ++buf[i - 1];
          }
          if (buf[0] > '9') {
            buf[0] = '1';
            if (fixed)
              buf[precision++] = '0';
            else
              ++exp;
          }
        }
        buf.try_resize(to_unsigned(precision));
      }
    }  // if (digits_in_the_first_segment > precision)
    else {
      // Adjust the exponent for its use in Dragon4.
      exp += digits_in_the_first_segment - 1;
    }
  }
  if (use_dragon) {
    auto f = basic_fp<uint128_t>();
    bool is_predecessor_closer = specs.binary32
                                     ? f.assign(static_cast<float>(value))
                                     : f.assign(converted_value);
    if (is_predecessor_closer) dragon_flags |= dragon::predecessor_closer;
    if (fixed) dragon_flags |= dragon::fixed;
    // Limit precision to the maximum possible number of significant digits in
    // an IEEE754 double because we don't need to generate zeros.
    const int max_double_digits = 767;
    if (precision > max_double_digits) precision = max_double_digits;
    format_dragon(f, dragon_flags, precision, buf, exp);
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}